

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void help(void)

{
  fwrite("-P process_id\n-d path for concatenation\n-u do not sort by event/period ID\n-h help\n-v version\n"
         ,0x5d,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr,
		"-P process_id\n"
		"-d path for concatenation\n"
		"-u do not sort by event/period ID\n"
		"-h help\n"
		"-v version\n"
	);
}